

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_ameth.c
# Opt level: O0

int param_copy_gost_ec(EVP_PKEY *to,EVP_PKEY *from)

{
  int iVar1;
  int iVar2;
  EC_KEY *key;
  EC_GROUP *group;
  BIGNUM *pBVar3;
  EVP_PKEY *in_RSI;
  EVP_PKEY *in_RDI;
  EC_KEY *efrom;
  EC_KEY *eto;
  char *in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  int function;
  EC_KEY *key_00;
  EC_KEY *local_20;
  int local_4;
  
  local_20 = (EC_KEY *)EVP_PKEY_get0(in_RDI);
  key = (EC_KEY *)EVP_PKEY_get0(in_RSI);
  iVar1 = EVP_PKEY_get_base_id(in_RSI);
  iVar2 = EVP_PKEY_get_base_id(in_RDI);
  function = (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20);
  if (iVar1 == iVar2) {
    if (key == (EC_KEY *)0x0) {
      ERR_GOST_error(function,(int)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,0);
      local_4 = 0;
    }
    else {
      if (local_20 == (EC_KEY *)0x0) {
        local_20 = EC_KEY_new();
        if (local_20 == (EC_KEY *)0x0) {
          ERR_GOST_error((int)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                         (int)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,0);
          return 0;
        }
        iVar1 = EVP_PKEY_get_base_id(in_RSI);
        iVar1 = EVP_PKEY_assign(in_RDI,iVar1,local_20);
        if (iVar1 == 0) {
          ERR_GOST_error((int)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                         (int)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,0);
          EC_KEY_free(local_20);
          return 0;
        }
      }
      key_00 = local_20;
      group = EC_KEY_get0_group(key);
      iVar1 = EC_KEY_set_group(key_00,group);
      if (iVar1 == 0) {
        ERR_GOST_error((int)((ulong)key_00 >> 0x20),(int)key_00,in_stack_ffffffffffffffb8,0);
        local_4 = 0;
      }
      else {
        pBVar3 = EC_KEY_get0_private_key(local_20);
        if (pBVar3 == (BIGNUM *)0x0) {
          local_4 = 1;
        }
        else {
          local_4 = gost_ec_compute_public((EC_KEY *)in_RSI);
        }
      }
    }
  }
  else {
    ERR_GOST_error(function,(int)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,0);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int param_copy_gost_ec(EVP_PKEY *to, const EVP_PKEY *from)
{
    EC_KEY *eto = EVP_PKEY_get0(to);
    const EC_KEY *efrom = EVP_PKEY_get0((EVP_PKEY *)from);
    if (EVP_PKEY_base_id(from) != EVP_PKEY_base_id(to)) {
        GOSTerr(GOST_F_PARAM_COPY_GOST_EC, GOST_R_INCOMPATIBLE_ALGORITHMS);
        return 0;
    }
    if (!efrom) {
        GOSTerr(GOST_F_PARAM_COPY_GOST_EC, GOST_R_KEY_PARAMETERS_MISSING);
        return 0;
    }
    if (!eto) {
        eto = EC_KEY_new();
        if (!eto) {
            GOSTerr(GOST_F_PARAM_COPY_GOST_EC, ERR_R_MALLOC_FAILURE);
            return 0;
        }
        if (!EVP_PKEY_assign(to, EVP_PKEY_base_id(from), eto)) {
            GOSTerr(GOST_F_PARAM_COPY_GOST_EC, ERR_R_INTERNAL_ERROR);
            EC_KEY_free(eto);
            return 0;
        }
    }
    if (!EC_KEY_set_group(eto, EC_KEY_get0_group(efrom))) {
        GOSTerr(GOST_F_PARAM_COPY_GOST_EC, ERR_R_INTERNAL_ERROR);
        return 0;
    }
    if (EC_KEY_get0_private_key(eto)) {
        return gost_ec_compute_public(eto);
    }
    return 1;
}